

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.c
# Opt level: O3

void av1_convolve_2d_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int32_t subpel_x_qn,int32_t subpel_y_qn,ConvolveParams *conv_params)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  ushort uVar8;
  int16_t *piVar9;
  int16_t *piVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  bool bVar43;
  uint uVar44;
  long lVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  int iVar52;
  undefined1 (*pauVar53) [16];
  ulong uVar54;
  uint uVar55;
  int iVar56;
  long lVar57;
  ulong uVar58;
  undefined1 (*pauVar59) [16];
  undefined1 (*pauVar60) [16];
  uint8_t *puVar61;
  undefined4 in_register_00000034;
  long lVar62;
  undefined1 (*pauVar63) [32];
  ulong uVar64;
  long lVar65;
  long lVar66;
  int iVar67;
  undefined8 *puVar68;
  short sVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  int16_t im_block [1120];
  ulong local_8f70;
  uint8_t *local_8f68;
  undefined1 (*local_8f50) [16];
  undefined1 (*local_8f48) [16];
  undefined1 local_8f00 [32];
  uint local_8ec0;
  undefined1 local_8ea0 [32];
  undefined1 local_8e40 [32];
  undefined1 local_8e00 [32];
  undefined1 local_8de0 [32];
  undefined1 local_8dc0 [32];
  undefined1 local_8c60 [16];
  undefined1 auStack_8c50 [16];
  undefined1 local_8c40 [16];
  undefined1 auStack_8c30 [16];
  undefined1 local_8c20 [16];
  undefined1 auStack_8c10 [16];
  undefined1 local_8c00 [16];
  undefined1 auStack_8bf0 [16];
  undefined1 local_8be0 [16];
  undefined1 auStack_8bd0 [16];
  undefined1 local_8bc0 [16];
  undefined1 auStack_8bb0 [35712];
  
  local_8f70 = CONCAT44(in_register_00000034,src_stride);
  uVar8 = filter_params_x->taps;
  uVar58 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar8);
  uVar54 = (ulong)((subpel_y_qn & 0xfU) * (uint)filter_params_y->taps);
  piVar9 = filter_params_x->filter_ptr;
  piVar10 = filter_params_y->filter_ptr;
  if (filter_params_y->taps != 0xc) {
    if (uVar8 != 0xc) {
      lVar66 = 8;
      if ((piVar9[uVar58 + 7] == 0 && piVar9[uVar58] == 0) &&
         (lVar66 = 6, piVar9[uVar58 + 6] == 0 && piVar9[uVar58 + 1] == 0)) {
        lVar66 = (ulong)(piVar9[uVar58 + 5] != 0 || piVar9[uVar58 + 2] != 0) * 2 + 2;
      }
      uVar58 = 8;
      if ((piVar10[uVar54 + 7] == 0 && piVar10[uVar54] == 0) &&
         (uVar58 = 6, piVar10[uVar54 + 6] == 0 && piVar10[uVar54 + 1] == 0)) {
        uVar58 = (ulong)((uint)(piVar10[uVar54 + 5] != 0 || piVar10[uVar54 + 2] != 0) * 2 + 2);
      }
      (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_hor_tap_func_table +
                  lVar66 * 8))
                ((long)src - (long)(((int)(uVar58 >> 1) + -1) * src_stride),local_8f70,w,
                 (int)uVar58 + h,filter_params_x,subpel_x_qn,local_8c60);
      (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_ver_tap_func_table +
                  (ulong)((int)uVar58 - (uint)(subpel_y_qn == 8)) * 8))
                (local_8c60,w,h,filter_params_y,subpel_y_qn,dst,dst_stride);
      return;
    }
LAB_0044538a:
    iVar56 = conv_params->round_0;
    iVar67 = conv_params->round_1;
    bVar46 = (byte)iVar56;
    bVar47 = 0x16 - bVar46;
    uVar55 = 0xe - (iVar56 + iVar67);
    bVar48 = (byte)iVar67;
    iVar56 = 1 << (bVar47 - bVar48 & 0x1f);
    if (0 < w) {
      iVar67 = ((1 << (bVar46 & 0x1f)) >> 1) + 0x4000;
      auVar70 = ZEXT416((uint)conv_params->round_0);
      local_8dc0._4_4_ = ((1 << (bVar48 & 0x1f)) >> 1) + (1 << (bVar47 & 0x1f));
      local_8dc0._0_4_ = local_8dc0._4_4_;
      local_8dc0._8_4_ = local_8dc0._4_4_;
      local_8dc0._12_4_ = local_8dc0._4_4_;
      local_8dc0._16_4_ = local_8dc0._4_4_;
      local_8dc0._20_4_ = local_8dc0._4_4_;
      local_8dc0._24_4_ = local_8dc0._4_4_;
      local_8dc0._28_4_ = local_8dc0._4_4_;
      local_8de0._4_4_ = ((1 << ((byte)uVar55 & 0x1f)) >> 1) - ((iVar56 >> 1) + iVar56);
      local_8de0._0_4_ = local_8de0._4_4_;
      local_8de0._8_4_ = local_8de0._4_4_;
      local_8de0._12_4_ = local_8de0._4_4_;
      local_8de0._16_4_ = local_8de0._4_4_;
      local_8de0._20_4_ = local_8de0._4_4_;
      local_8de0._24_4_ = local_8de0._4_4_;
      local_8de0._28_4_ = local_8de0._4_4_;
      uVar44 = h + 0xb;
      uVar49 = (undefined4)*(undefined8 *)(piVar10 + uVar54 + 8);
      local_8e00._4_4_ = (undefined4)((ulong)*(undefined8 *)(piVar10 + uVar54 + 8) >> 0x20);
      local_8e00._0_4_ = local_8e00._4_4_;
      local_8e00._8_4_ = local_8e00._4_4_;
      local_8e00._12_4_ = local_8e00._4_4_;
      local_8e00._16_4_ = local_8e00._4_4_;
      local_8e00._20_4_ = local_8e00._4_4_;
      local_8e00._24_4_ = local_8e00._4_4_;
      local_8e00._28_4_ = local_8e00._4_4_;
      uVar6 = *(undefined4 *)(piVar10 + uVar54 + 6);
      local_8e40._4_4_ = *(undefined4 *)(piVar10 + uVar54 + 4);
      local_8e40._0_4_ = local_8e40._4_4_;
      local_8e40._8_4_ = local_8e40._4_4_;
      local_8e40._12_4_ = local_8e40._4_4_;
      local_8e40._16_4_ = local_8e40._4_4_;
      local_8e40._20_4_ = local_8e40._4_4_;
      local_8e40._24_4_ = local_8e40._4_4_;
      local_8e40._28_4_ = local_8e40._4_4_;
      uVar1 = *(undefined4 *)(piVar10 + uVar54 + 2);
      uVar2 = *(undefined4 *)(piVar10 + uVar54);
      uVar50 = (undefined4)*(undefined8 *)(piVar9 + uVar58 + 8);
      uVar51 = (undefined4)((ulong)*(undefined8 *)(piVar9 + uVar58 + 8) >> 0x20);
      auVar78._4_4_ = uVar51;
      auVar78._0_4_ = uVar51;
      auVar78._8_4_ = uVar51;
      auVar78._12_4_ = uVar51;
      auVar78._16_4_ = uVar51;
      auVar78._20_4_ = uVar51;
      auVar78._24_4_ = uVar51;
      auVar78._28_4_ = uVar51;
      uVar51 = *(undefined4 *)(piVar9 + uVar58 + 6);
      uVar3 = *(undefined4 *)(piVar9 + uVar58 + 4);
      uVar4 = *(undefined4 *)(piVar9 + uVar58 + 2);
      uVar5 = *(undefined4 *)(piVar9 + uVar58);
      uVar54 = 1;
      if (1 < (int)uVar44) {
        uVar54 = (ulong)uVar44;
      }
      lVar66 = (long)dst_stride;
      local_8f48 = (undefined1 (*) [16])(src + ~(long)(src_stride * 5));
      uVar58 = 0;
      auVar79 = ZEXT416((uint)conv_params->round_1);
      local_8f50 = (undefined1 (*) [16])(src + (-5 - (long)(src_stride * 5)));
      do {
        if ((uint)w < 5) {
          if (-0xb < h) {
            uVar64 = local_8f70 & 0xffffffff;
            puVar68 = (undefined8 *)local_8c60;
            lVar45 = 0;
            auVar23._4_4_ = iVar67;
            auVar23._0_4_ = iVar67;
            auVar23._8_4_ = iVar67;
            auVar23._12_4_ = iVar67;
            auVar23._16_4_ = iVar67;
            auVar23._20_4_ = iVar67;
            auVar23._24_4_ = iVar67;
            auVar23._28_4_ = iVar67;
            auVar21._4_4_ = uVar50;
            auVar21._0_4_ = uVar50;
            auVar21._8_4_ = uVar50;
            auVar21._12_4_ = uVar50;
            auVar21._16_4_ = uVar50;
            auVar21._20_4_ = uVar50;
            auVar21._24_4_ = uVar50;
            auVar21._28_4_ = uVar50;
            auVar19._4_4_ = uVar51;
            auVar19._0_4_ = uVar51;
            auVar19._8_4_ = uVar51;
            auVar19._12_4_ = uVar51;
            auVar19._16_4_ = uVar51;
            auVar19._20_4_ = uVar51;
            auVar19._24_4_ = uVar51;
            auVar19._28_4_ = uVar51;
            auVar17._4_4_ = uVar3;
            auVar17._0_4_ = uVar3;
            auVar17._8_4_ = uVar3;
            auVar17._12_4_ = uVar3;
            auVar17._16_4_ = uVar3;
            auVar17._20_4_ = uVar3;
            auVar17._24_4_ = uVar3;
            auVar17._28_4_ = uVar3;
            auVar16._4_4_ = uVar4;
            auVar16._0_4_ = uVar4;
            auVar16._8_4_ = uVar4;
            auVar16._12_4_ = uVar4;
            auVar16._16_4_ = uVar4;
            auVar16._20_4_ = uVar4;
            auVar16._24_4_ = uVar4;
            auVar16._28_4_ = uVar4;
            auVar15._4_4_ = uVar5;
            auVar15._0_4_ = uVar5;
            auVar15._8_4_ = uVar5;
            auVar15._12_4_ = uVar5;
            auVar15._16_4_ = uVar5;
            auVar15._20_4_ = uVar5;
            auVar15._24_4_ = uVar5;
            auVar15._28_4_ = uVar5;
            pauVar53 = local_8f50;
            do {
              auVar7 = *(undefined1 (*) [16])
                        (*(undefined1 (*) [16])(src + (-5 - (long)(src_stride * 5))) + (int)uVar64);
              auVar80._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * *pauVar53;
              auVar80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
              auVar11 = vpunpcklbw_avx2(auVar80,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              auVar83 = vpunpckhbw_avx2(auVar80,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              auVar77 = vpshufd_avx2(auVar11,0xe6);
              auVar12 = vpshuflw_avx2(auVar77,0x50);
              auVar82 = vpshufhw_avx2(auVar12,0xfa);
              auVar12 = vpunpcklwd_avx2(auVar11,auVar11);
              auVar77 = vpalignr_avx2(auVar77,auVar12,2);
              auVar12 = vpalignr_avx2(auVar82,auVar12,10);
              auVar85 = vpunpcklwd_avx2(auVar83,auVar83);
              auVar11 = vpalignr_avx2(auVar83,auVar82,2);
              auVar82 = vpalignr_avx2(auVar85,auVar82,10);
              auVar83 = vpshufd_avx2(auVar83,0xe6);
              auVar84 = vpshuflw_avx2(auVar83,0x50);
              auVar84 = vpshufd_avx2(auVar84,0xf4);
              auVar83 = vpalignr_avx2(auVar83,auVar85,2);
              auVar84 = vpalignr_avx2(auVar84,auVar85,10);
              auVar85 = vpmaddwd_avx2(auVar15,auVar77);
              auVar86 = vpmaddwd_avx2(auVar16,auVar12);
              auVar77 = vpmaddwd_avx2(auVar17,auVar11);
              auVar12 = vpmaddwd_avx2(auVar19,auVar82);
              auVar77 = vpaddd_avx2(auVar77,auVar12);
              auVar12 = vpmaddwd_avx2(auVar21,auVar83);
              auVar11 = vpmaddwd_avx2(auVar78,auVar84);
              auVar12 = vpaddd_avx2(auVar12,auVar11);
              auVar11 = vpaddd_avx2(auVar85,auVar23);
              auVar11 = vpaddd_avx2(auVar11,auVar86);
              auVar77 = vpaddd_avx2(auVar11,auVar77);
              auVar77 = vpaddd_avx2(auVar77,auVar12);
              auVar77 = vpsrad_avx2(auVar77,auVar70);
              auVar77 = vpackssdw_avx2(auVar77,auVar23);
              if ((uint)w < 3) {
                *(short *)puVar68 = auVar77._0_2_;
                *(short *)((long)puVar68 + 2) = auVar77._2_2_;
                *(short *)(puVar68 + 2) = auVar77._16_2_;
                *(short *)((long)puVar68 + 0x12) = auVar77._18_2_;
              }
              else {
                *puVar68 = auVar77._0_8_;
                puVar68[2] = auVar77._16_8_;
              }
              lVar45 = lVar45 + 2;
              puVar68 = puVar68 + 4;
              uVar64 = (ulong)(uint)((int)uVar64 + src_stride * 2);
              pauVar53 = (undefined1 (*) [16])(*pauVar53 + (long)src_stride * 2);
            } while (lVar45 < (int)uVar44);
LAB_0044586f:
            if (0 < h) {
              auVar41._16_16_ = auStack_8bd0;
              auVar41._0_16_ = local_8be0;
              auVar42._16_16_ = local_8bc0;
              auVar42._0_16_ = auStack_8bd0;
              auVar77 = vpunpckhwd_avx2(auVar41,auVar42);
              auVar39._16_16_ = auStack_8bf0;
              auVar39._0_16_ = local_8c00;
              auVar40._16_16_ = local_8be0;
              auVar40._0_16_ = auStack_8bf0;
              auVar12 = vpunpckhwd_avx2(auVar39,auVar40);
              auVar35._16_16_ = auStack_8c10;
              auVar35._0_16_ = local_8c20;
              auVar37._16_16_ = local_8c00;
              auVar37._0_16_ = auStack_8c10;
              auVar11 = vpunpckhwd_avx2(auVar35,auVar37);
              auVar31._16_16_ = auStack_8c30;
              auVar31._0_16_ = local_8c40;
              auVar33._16_16_ = local_8c20;
              auVar33._0_16_ = auStack_8c30;
              auVar82 = vpunpckhwd_avx2(auVar31,auVar33);
              auVar27._16_16_ = auStack_8c50;
              auVar27._0_16_ = local_8c60;
              auVar29._16_16_ = local_8c40;
              auVar29._0_16_ = auStack_8c50;
              auVar83 = vpunpckhwd_avx2(auVar27,auVar29);
              auVar84 = vpunpcklwd_avx2(auVar41,auVar42);
              auVar85 = vpunpcklwd_avx2(auVar39,auVar40);
              auVar86 = vpunpcklwd_avx2(auVar35,auVar37);
              auVar87 = vpunpcklwd_avx2(auVar31,auVar33);
              auVar89 = vpunpcklwd_avx2(auVar27,auVar29);
              pauVar63 = (undefined1 (*) [32])auStack_8bb0;
              lVar45 = 0;
              puVar61 = dst;
              do {
                auVar73 = auVar77;
                auVar71 = auVar82;
                auVar82 = auVar11;
                auVar72 = auVar85;
                auVar76 = auVar87;
                auVar75 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar63[-1] + 0x10),*pauVar63);
                auVar77 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar63[-1] + 0x10),*pauVar63);
                auVar13._4_4_ = uVar1;
                auVar13._0_4_ = uVar1;
                auVar13._8_4_ = uVar1;
                auVar13._12_4_ = uVar1;
                auVar13._16_4_ = uVar1;
                auVar13._20_4_ = uVar1;
                auVar13._24_4_ = uVar1;
                auVar13._28_4_ = uVar1;
                auVar11 = vpmaddwd_avx2(auVar76,auVar13);
                auVar85 = vpmaddwd_avx2(auVar86,local_8e40);
                auVar11 = vpaddd_avx2(auVar11,auVar85);
                auVar14._4_4_ = uVar6;
                auVar14._0_4_ = uVar6;
                auVar14._8_4_ = uVar6;
                auVar14._12_4_ = uVar6;
                auVar14._16_4_ = uVar6;
                auVar14._20_4_ = uVar6;
                auVar14._24_4_ = uVar6;
                auVar14._28_4_ = uVar6;
                auVar85 = vpmaddwd_avx2(auVar72,auVar14);
                auVar26._4_4_ = uVar49;
                auVar26._0_4_ = uVar49;
                auVar26._8_4_ = uVar49;
                auVar26._12_4_ = uVar49;
                auVar26._16_4_ = uVar49;
                auVar26._20_4_ = uVar49;
                auVar26._24_4_ = uVar49;
                auVar26._28_4_ = uVar49;
                auVar87 = vpmaddwd_avx2(auVar84,auVar26);
                auVar85 = vpaddd_avx2(auVar85,auVar87);
                auVar87 = vpmaddwd_avx2(auVar71,auVar13);
                auVar88 = vpmaddwd_avx2(auVar82,local_8e40);
                auVar87 = vpaddd_avx2(auVar87,auVar88);
                auVar88 = vpmaddwd_avx2(auVar12,auVar14);
                auVar74 = vpmaddwd_avx2(auVar73,auVar26);
                auVar88 = vpaddd_avx2(auVar88,auVar74);
                auVar25._4_4_ = uVar2;
                auVar25._0_4_ = uVar2;
                auVar25._8_4_ = uVar2;
                auVar25._12_4_ = uVar2;
                auVar25._16_4_ = uVar2;
                auVar25._20_4_ = uVar2;
                auVar25._24_4_ = uVar2;
                auVar25._28_4_ = uVar2;
                auVar89 = vpmaddwd_avx2(auVar89,auVar25);
                auVar89 = vpaddd_avx2(auVar89,local_8dc0);
                auVar11 = vpaddd_avx2(auVar89,auVar11);
                auVar11 = vpaddd_avx2(auVar11,auVar85);
                auVar85 = vpmaddwd_avx2(local_8e00,auVar75);
                auVar11 = vpaddd_avx2(auVar85,auVar11);
                auVar83 = vpmaddwd_avx2(auVar83,auVar25);
                auVar83 = vpaddd_avx2(auVar83,local_8dc0);
                auVar83 = vpaddd_avx2(auVar83,auVar87);
                auVar83 = vpaddd_avx2(auVar83,auVar88);
                auVar85 = vpmaddwd_avx2(local_8e00,auVar77);
                auVar83 = vpaddd_avx2(auVar83,auVar85);
                auVar11 = vpsrad_avx2(auVar11,auVar79);
                auVar83 = vpsrad_avx2(auVar83,auVar79);
                auVar11 = vpaddd_avx2(auVar11,local_8de0);
                auVar85 = vpsrad_avx2(auVar11,ZEXT416(uVar55));
                auVar11 = vpaddd_avx2(auVar83,local_8de0);
                auVar11 = vpsrad_avx2(auVar11,ZEXT416(uVar55));
                auVar11 = vpackssdw_avx2(auVar85,auVar11);
                auVar11 = vpackuswb_avx2(auVar11,auVar11);
                if ((long)uVar58 < (long)((ulong)(uint)w - 4)) {
                  *(long *)puVar61 = auVar11._0_8_;
                  *(long *)(puVar61 + lVar66) = auVar11._16_8_;
                }
                else if (w == 4) {
                  *(int *)puVar61 = auVar11._0_4_;
                  *(int *)(puVar61 + lVar66) = auVar11._16_4_;
                }
                else {
                  vpextrw_avx(auVar11._0_16_,0);
                  vpextrw_avx(auVar11._16_16_,0);
                }
                lVar45 = lVar45 + 2;
                puVar61 = puVar61 + lVar66 * 2;
                pauVar63 = pauVar63 + 1;
                auVar87 = auVar86;
                auVar85 = auVar84;
                auVar11 = auVar12;
                auVar84 = auVar75;
                auVar86 = auVar72;
                auVar83 = auVar71;
                auVar12 = auVar73;
                auVar89 = auVar76;
              } while (lVar45 < h);
            }
          }
        }
        else if (-0xb < h) {
          lVar45 = 0;
          auVar24._4_4_ = iVar67;
          auVar24._0_4_ = iVar67;
          auVar24._8_4_ = iVar67;
          auVar24._12_4_ = iVar67;
          auVar24._16_4_ = iVar67;
          auVar24._20_4_ = iVar67;
          auVar24._24_4_ = iVar67;
          auVar24._28_4_ = iVar67;
          auVar22._4_4_ = uVar50;
          auVar22._0_4_ = uVar50;
          auVar22._8_4_ = uVar50;
          auVar22._12_4_ = uVar50;
          auVar22._16_4_ = uVar50;
          auVar22._20_4_ = uVar50;
          auVar22._24_4_ = uVar50;
          auVar22._28_4_ = uVar50;
          auVar20._4_4_ = uVar51;
          auVar20._0_4_ = uVar51;
          auVar20._8_4_ = uVar51;
          auVar20._12_4_ = uVar51;
          auVar20._16_4_ = uVar51;
          auVar20._20_4_ = uVar51;
          auVar20._24_4_ = uVar51;
          auVar20._28_4_ = uVar51;
          auVar18._4_4_ = uVar3;
          auVar18._0_4_ = uVar3;
          auVar18._8_4_ = uVar3;
          auVar18._12_4_ = uVar3;
          auVar18._16_4_ = uVar3;
          auVar18._20_4_ = uVar3;
          auVar18._24_4_ = uVar3;
          auVar18._28_4_ = uVar3;
          auVar11._4_4_ = uVar4;
          auVar11._0_4_ = uVar4;
          auVar11._8_4_ = uVar4;
          auVar11._12_4_ = uVar4;
          auVar11._16_4_ = uVar4;
          auVar11._20_4_ = uVar4;
          auVar11._24_4_ = uVar4;
          auVar11._28_4_ = uVar4;
          auVar12._4_4_ = uVar5;
          auVar12._0_4_ = uVar5;
          auVar12._8_4_ = uVar5;
          auVar12._12_4_ = uVar5;
          auVar12._16_4_ = uVar5;
          auVar12._20_4_ = uVar5;
          auVar12._24_4_ = uVar5;
          auVar12._28_4_ = uVar5;
          pauVar53 = local_8f48;
          do {
            auVar81._0_16_ =
                 ZEXT116(0) * *pauVar53 + ZEXT116(1) * *(undefined1 (*) [16])(pauVar53[-1] + 0xc);
            auVar81._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *pauVar53
            ;
            auVar83 = vpunpcklbw_avx2(auVar81,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar85 = vpunpckhbw_avx2(auVar81,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar77 = vpshufd_avx2(auVar83,0xe6);
            auVar82 = vpshuflw_avx2(auVar77,0x50);
            auVar84 = vpshufhw_avx2(auVar82,0xfa);
            auVar82 = vpunpcklwd_avx2(auVar83,auVar83);
            auVar77 = vpalignr_avx2(auVar77,auVar82,2);
            auVar82 = vpalignr_avx2(auVar84,auVar82,10);
            auVar87 = vpunpcklwd_avx2(auVar85,auVar85);
            auVar83 = vpalignr_avx2(auVar85,auVar84,2);
            auVar84 = vpalignr_avx2(auVar87,auVar84,10);
            auVar85 = vpshufd_avx2(auVar85,0xe6);
            auVar86 = vpshuflw_avx2(auVar85,0x50);
            auVar86 = vpshufd_avx2(auVar86,0xf4);
            auVar85 = vpalignr_avx2(auVar85,auVar87,2);
            auVar86 = vpalignr_avx2(auVar86,auVar87,10);
            auVar87 = vpmaddwd_avx2(auVar12,auVar77);
            auVar89 = vpmaddwd_avx2(auVar11,auVar82);
            auVar77 = vpmaddwd_avx2(auVar18,auVar83);
            auVar82 = vpmaddwd_avx2(auVar20,auVar84);
            auVar77 = vpaddd_avx2(auVar77,auVar82);
            auVar82 = vpmaddwd_avx2(auVar22,auVar85);
            auVar83 = vpmaddwd_avx2(auVar78,auVar86);
            auVar82 = vpaddd_avx2(auVar82,auVar83);
            auVar83 = vpaddd_avx2(auVar87,auVar24);
            auVar83 = vpaddd_avx2(auVar83,auVar89);
            auVar77 = vpaddd_avx2(auVar83,auVar77);
            auVar77 = vpaddd_avx2(auVar77,auVar82);
            auVar77 = vpsrad_avx2(auVar77,auVar70);
            auVar7 = vpackssdw_avx(auVar77._0_16_,auVar77._16_16_);
            *(undefined1 (*) [16])(local_8c60 + lVar45) = auVar7;
            lVar45 = lVar45 + 0x10;
            pauVar53 = (undefined1 (*) [16])(*pauVar53 + src_stride);
          } while (uVar54 << 4 != lVar45);
          goto LAB_0044586f;
        }
        uVar58 = uVar58 + 8;
        local_8f48 = (undefined1 (*) [16])(*local_8f48 + 8);
        local_8f70 = (ulong)((int)local_8f70 + 8);
        local_8f50 = (undefined1 (*) [16])(*local_8f50 + 8);
        dst = dst + 8;
      } while (uVar58 < (uint)w);
    }
    return;
  }
  if (8 < uVar8) goto LAB_0044538a;
  iVar56 = conv_params->round_0;
  iVar67 = conv_params->round_1;
  bVar46 = 0x16 - (char)iVar56;
  bVar47 = (byte)iVar67;
  uVar55 = 0xe - (iVar56 + iVar67);
  iVar67 = 1 << (bVar46 - bVar47 & 0x1f);
  auVar70 = *(undefined1 (*) [16])(piVar9 + uVar58);
  auVar77._16_16_ = auVar70;
  auVar77._0_16_ = auVar70;
  auVar77 = vpsraw_avx2(auVar77,1);
  auVar79 = vpsrldq_avx(auVar70,0xe);
  auVar79 = vpor_avx(auVar79,auVar70);
  local_8ec0 = 8;
  if (auVar79._0_2_ == 0) {
    auVar79 = vpsrldq_avx(auVar70,10);
    auVar79 = vpor_avx(auVar79,auVar70);
    iVar52 = vpextrw_avx(auVar79,1);
    if (iVar52 != 0) {
      auVar78 = vpshufb_avx2(auVar77,_DAT_0056a6c0);
      auVar11 = vpshufb_avx2(auVar77,_DAT_0056a6e0);
      auVar12 = vpshufb_avx2(auVar77,_DAT_0056a700);
      local_8ec0 = 6;
      bVar43 = true;
      goto LAB_00445c3d;
    }
    auVar79 = vpsrldq_avx(auVar70,6);
    auVar70 = vpor_avx(auVar79,auVar70);
    iVar52 = vpextrw_avx(auVar70,2);
    local_8ec0 = (uint)(iVar52 != 0) * 2 + 2;
  }
  auVar11 = vpshufb_avx2(auVar77,_DAT_0056a660);
  auVar12 = vpshufb_avx2(auVar77,_DAT_0056a680);
  auVar78 = vpshufb_avx2(auVar77,_DAT_0056a720);
  bVar43 = false;
LAB_00445c3d:
  if (w < 1) {
    return;
  }
  sVar69 = (short)((uint)(1 << ((byte)(iVar56 - 1U) & 0x1f)) >> 1) + 0x2000;
  local_8f00._4_4_ = ((1 << (bVar47 & 0x1f)) >> 1) + (1 << (bVar46 & 0x1f));
  local_8ea0._4_4_ = ((1 << ((byte)uVar55 & 0x1f)) >> 1) - ((iVar67 >> 1) + iVar67);
  auVar83._2_2_ = sVar69;
  auVar83._0_2_ = sVar69;
  auVar83._4_2_ = sVar69;
  auVar83._6_2_ = sVar69;
  auVar83._8_2_ = sVar69;
  auVar83._10_2_ = sVar69;
  auVar83._12_2_ = sVar69;
  auVar83._14_2_ = sVar69;
  auVar83._16_2_ = sVar69;
  auVar83._18_2_ = sVar69;
  auVar83._20_2_ = sVar69;
  auVar83._22_2_ = sVar69;
  auVar83._24_2_ = sVar69;
  auVar83._26_2_ = sVar69;
  auVar83._28_2_ = sVar69;
  auVar83._30_2_ = sVar69;
  local_8f00._0_4_ = local_8f00._4_4_;
  local_8f00._8_4_ = local_8f00._4_4_;
  local_8f00._12_4_ = local_8f00._4_4_;
  local_8f00._16_4_ = local_8f00._4_4_;
  local_8f00._20_4_ = local_8f00._4_4_;
  local_8f00._24_4_ = local_8f00._4_4_;
  local_8f00._28_4_ = local_8f00._4_4_;
  auVar70 = ZEXT416((uint)conv_params->round_1);
  local_8ea0._0_4_ = local_8ea0._4_4_;
  local_8ea0._8_4_ = local_8ea0._4_4_;
  local_8ea0._12_4_ = local_8ea0._4_4_;
  local_8ea0._16_4_ = local_8ea0._4_4_;
  local_8ea0._20_4_ = local_8ea0._4_4_;
  local_8ea0._24_4_ = local_8ea0._4_4_;
  local_8ea0._28_4_ = local_8ea0._4_4_;
  auVar77 = vpshufb_avx2(auVar77,_DAT_0056a6a0);
  uVar6 = *(undefined4 *)(piVar10 + uVar54 + 2);
  auVar84._4_4_ = uVar6;
  auVar84._0_4_ = uVar6;
  auVar84._8_4_ = uVar6;
  auVar84._12_4_ = uVar6;
  auVar84._16_4_ = uVar6;
  auVar84._20_4_ = uVar6;
  auVar84._24_4_ = uVar6;
  auVar84._28_4_ = uVar6;
  uVar6 = *(undefined4 *)(piVar10 + uVar54 + 4);
  auVar85._4_4_ = uVar6;
  auVar85._0_4_ = uVar6;
  auVar85._8_4_ = uVar6;
  auVar85._12_4_ = uVar6;
  auVar85._16_4_ = uVar6;
  auVar85._20_4_ = uVar6;
  auVar85._24_4_ = uVar6;
  auVar85._28_4_ = uVar6;
  uVar6 = *(undefined4 *)(piVar10 + uVar54 + 6);
  auVar86._4_4_ = uVar6;
  auVar86._0_4_ = uVar6;
  auVar86._8_4_ = uVar6;
  auVar86._12_4_ = uVar6;
  auVar86._16_4_ = uVar6;
  auVar86._20_4_ = uVar6;
  auVar86._24_4_ = uVar6;
  auVar86._28_4_ = uVar6;
  pauVar59 = (undefined1 (*) [16])(src + (-(ulong)((local_8ec0 >> 1) - 1) - (long)(src_stride * 5)))
  ;
  uVar6 = *(undefined4 *)(piVar10 + uVar54);
  auVar87._4_4_ = uVar6;
  auVar87._0_4_ = uVar6;
  auVar87._8_4_ = uVar6;
  auVar87._12_4_ = uVar6;
  auVar87._16_4_ = uVar6;
  auVar87._20_4_ = uVar6;
  auVar87._24_4_ = uVar6;
  auVar87._28_4_ = uVar6;
  lVar45 = (long)src_stride;
  lVar57 = (long)(h + 9);
  lVar65 = (long)dst_stride;
  lVar66 = lVar45 * 2;
  uVar54 = 0;
  auVar89._16_16_ = _DAT_00516300;
  auVar89._0_16_ = _DAT_00516300;
  auVar82._16_16_ = _DAT_00515ee0;
  auVar82._0_16_ = _DAT_00515ee0;
  pauVar53 = pauVar59;
  local_8f68 = dst;
  do {
    auVar79 = ZEXT416(iVar56 - 1U);
    if (local_8ec0 == 4) {
      lVar62 = 0;
      if (-9 < h) {
        pauVar63 = (undefined1 (*) [32])local_8c60;
        lVar62 = 0;
        pauVar60 = pauVar53;
        do {
          auVar71._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar60 + lVar45) + ZEXT116(1) * *pauVar60;
          auVar71._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar60 + lVar45);
          auVar88 = vpshufb_avx2(auVar71,auVar89);
          auVar74 = vpshufb_avx2(auVar71,auVar82);
          auVar88 = vpmaddubsw_avx2(auVar88,auVar11);
          auVar74 = vpmaddubsw_avx2(auVar74,auVar12);
          auVar88 = vpaddw_avx2(auVar88,auVar83);
          auVar88 = vpaddw_avx2(auVar88,auVar74);
          auVar88 = vpsraw_avx2(auVar88,auVar79);
          *pauVar63 = auVar88;
          lVar62 = lVar62 + 2;
          pauVar63 = pauVar63 + 1;
          pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar66);
        } while (lVar62 < lVar57);
      }
      iVar67 = (int)lVar62;
      auVar7 = *(undefined1 (*) [16])(*pauVar59 + (long)(iVar67 * src_stride) + uVar54);
      auVar72._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar7;
      auVar72._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
      auVar89 = vpshufb_avx2(auVar72,auVar89);
      auVar82 = vpshufb_avx2(auVar72,auVar82);
      auVar89 = vpmaddubsw_avx2(auVar89,auVar11);
      auVar82 = vpmaddubsw_avx2(auVar82,auVar12);
LAB_00445eb9:
      auVar89 = vpaddw_avx2(auVar89,auVar83);
    }
    else {
      if (bVar43) {
        lVar62 = 0;
        auVar88._16_16_ = _DAT_00515ef0;
        auVar88._0_16_ = _DAT_00515ef0;
        if (-9 < h) {
          pauVar63 = (undefined1 (*) [32])local_8c60;
          lVar62 = 0;
          pauVar60 = pauVar53;
          do {
            auVar73._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar60 + lVar45) + ZEXT116(1) * *pauVar60;
            auVar73._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar60 + lVar45);
            auVar74 = vpshufb_avx2(auVar73,auVar89);
            auVar75 = vpshufb_avx2(auVar73,auVar82);
            auVar76 = vpshufb_avx2(auVar73,auVar88);
            auVar73 = vpmaddubsw_avx2(auVar74,auVar78);
            auVar74 = vpmaddubsw_avx2(auVar75,auVar11);
            auVar75 = vpmaddubsw_avx2(auVar76,auVar12);
            auVar74 = vpaddw_avx2(auVar74,auVar75);
            auVar73 = vpaddw_avx2(auVar73,auVar83);
            auVar74 = vpaddw_avx2(auVar73,auVar74);
            auVar74 = vpsraw_avx2(auVar74,auVar79);
            *pauVar63 = auVar74;
            lVar62 = lVar62 + 2;
            pauVar63 = pauVar63 + 1;
            pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar66);
          } while (lVar62 < lVar57);
        }
        iVar67 = (int)lVar62;
        auVar7 = *(undefined1 (*) [16])(*pauVar59 + (long)(iVar67 * src_stride) + uVar54);
        auVar74._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar7;
        auVar74._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
        auVar89 = vpshufb_avx2(auVar74,auVar89);
        auVar82 = vpshufb_avx2(auVar74,auVar82);
        auVar88 = vpshufb_avx2(auVar74,auVar88);
        auVar89 = vpmaddubsw_avx2(auVar89,auVar78);
        auVar82 = vpmaddubsw_avx2(auVar82,auVar11);
        auVar88 = vpmaddubsw_avx2(auVar88,auVar12);
        auVar82 = vpaddw_avx2(auVar82,auVar88);
        goto LAB_00445eb9;
      }
      lVar62 = 0;
      if (-9 < h) {
        pauVar63 = (undefined1 (*) [32])local_8c60;
        lVar62 = 0;
        pauVar60 = pauVar53;
        do {
          auVar75._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar60 + lVar45) + ZEXT116(1) * *pauVar60;
          auVar75._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar60 + lVar45);
          auVar88 = vpshufb_avx2(auVar75,auVar89);
          auVar82 = vpshufb_avx2(auVar75,auVar82);
          auVar73 = vpshufb_avx2(auVar75,_DAT_00516c60);
          auVar75 = vpshufb_avx2(auVar75,_DAT_00516cc0);
          auVar74 = vpmaddubsw_avx2(auVar88,auVar78);
          auVar82 = vpmaddubsw_avx2(auVar82,auVar11);
          auVar88 = vpmaddubsw_avx2(auVar73,auVar12);
          auVar88 = vpaddw_avx2(auVar82,auVar88);
          auVar82._16_16_ = _DAT_00515ee0;
          auVar82._0_16_ = _DAT_00515ee0;
          auVar73 = vpmaddubsw_avx2(auVar75,auVar77);
          auVar74 = vpaddw_avx2(auVar74,auVar83);
          auVar88 = vpaddw_avx2(auVar74,auVar88);
          auVar88 = vpaddw_avx2(auVar88,auVar73);
          auVar88 = vpsraw_avx2(auVar88,auVar79);
          *pauVar63 = auVar88;
          lVar62 = lVar62 + 2;
          pauVar63 = pauVar63 + 1;
          pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar66);
        } while (lVar62 < lVar57);
      }
      iVar67 = (int)lVar62;
      auVar7 = *(undefined1 (*) [16])(*pauVar59 + (long)(iVar67 * src_stride) + uVar54);
      auVar76._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar7;
      auVar76._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
      auVar89 = vpshufb_avx2(auVar76,auVar89);
      auVar82 = vpshufb_avx2(auVar76,auVar82);
      auVar74 = vpshufb_avx2(auVar76,_DAT_00516c60);
      auVar73 = vpshufb_avx2(auVar76,_DAT_00516cc0);
      auVar88 = vpmaddubsw_avx2(auVar89,auVar78);
      auVar82 = vpmaddubsw_avx2(auVar82,auVar11);
      auVar89 = vpmaddubsw_avx2(auVar74,auVar12);
      auVar89 = vpaddw_avx2(auVar82,auVar89);
      auVar82 = vpmaddubsw_avx2(auVar73,auVar77);
      auVar88 = vpaddw_avx2(auVar88,auVar83);
      auVar89 = vpaddw_avx2(auVar88,auVar89);
    }
    auVar82 = vpaddw_avx2(auVar89,auVar82);
    auVar82 = vpsraw_avx2(auVar82,auVar79);
    *(undefined1 (*) [32])(local_8c60 + (ulong)(uint)(iVar67 << 3) * 2) = auVar82;
    if (0 < h) {
      auVar36._16_16_ = auStack_8c10;
      auVar36._0_16_ = local_8c20;
      auVar38._16_16_ = local_8c00;
      auVar38._0_16_ = auStack_8c10;
      auVar82 = vpunpckhwd_avx2(auVar36,auVar38);
      auVar32._16_16_ = auStack_8c30;
      auVar32._0_16_ = local_8c40;
      auVar34._16_16_ = local_8c20;
      auVar34._0_16_ = auStack_8c30;
      auVar89 = vpunpckhwd_avx2(auVar32,auVar34);
      auVar28._16_16_ = auStack_8c50;
      auVar28._0_16_ = local_8c60;
      auVar30._16_16_ = local_8c40;
      auVar30._0_16_ = auStack_8c50;
      auVar88 = vpunpckhwd_avx2(auVar28,auVar30);
      auVar74 = vpunpcklwd_avx2(auVar36,auVar38);
      auVar73 = vpunpcklwd_avx2(auVar32,auVar34);
      auVar75 = vpunpcklwd_avx2(auVar28,auVar30);
      pauVar63 = (undefined1 (*) [32])auStack_8bf0;
      lVar62 = 0;
      puVar61 = local_8f68;
      do {
        auVar30 = auVar74;
        auVar28 = auVar82;
        auVar74 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar63[-1] + 0x10),*pauVar63);
        auVar82 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar63[-1] + 0x10),*pauVar63);
        auVar76 = vpmaddwd_avx2(auVar73,auVar84);
        auVar71 = vpmaddwd_avx2(auVar85,auVar30);
        auVar76 = vpaddd_avx2(auVar76,auVar71);
        auVar71 = vpmaddwd_avx2(auVar89,auVar84);
        auVar72 = vpmaddwd_avx2(auVar85,auVar28);
        auVar71 = vpaddd_avx2(auVar71,auVar72);
        auVar75 = vpmaddwd_avx2(auVar87,auVar75);
        auVar75 = vpaddd_avx2(auVar75,local_8f00);
        auVar75 = vpaddd_avx2(auVar75,auVar76);
        auVar76 = vpmaddwd_avx2(auVar86,auVar74);
        auVar75 = vpaddd_avx2(auVar75,auVar76);
        auVar88 = vpmaddwd_avx2(auVar88,auVar87);
        auVar88 = vpaddd_avx2(auVar88,local_8f00);
        auVar88 = vpaddd_avx2(auVar88,auVar71);
        auVar76 = vpmaddwd_avx2(auVar86,auVar82);
        auVar88 = vpaddd_avx2(auVar88,auVar76);
        auVar75 = vpsrad_avx2(auVar75,auVar70);
        auVar76 = vpsrad_avx2(auVar88,auVar70);
        auVar88 = vpaddd_avx2(auVar75,local_8ea0);
        auVar75 = vpsrad_avx2(auVar88,ZEXT416(uVar55));
        auVar88 = vpaddd_avx2(auVar76,local_8ea0);
        auVar88 = vpsrad_avx2(auVar88,ZEXT416(uVar55));
        auVar88 = vpackssdw_avx2(auVar75,auVar88);
        auVar88 = vpackuswb_avx2(auVar88,auVar88);
        if ((long)uVar54 < (long)((ulong)(uint)w - 4)) {
          *(long *)puVar61 = auVar88._0_8_;
          *(long *)(puVar61 + lVar65) = auVar88._16_8_;
        }
        else if (w == 4) {
          *(int *)puVar61 = auVar88._0_4_;
          *(int *)(puVar61 + lVar65) = auVar88._16_4_;
        }
        else {
          vpextrw_avx(auVar88._0_16_,0);
          vpextrw_avx(auVar88._16_16_,0);
        }
        lVar62 = lVar62 + 2;
        puVar61 = puVar61 + lVar65 * 2;
        pauVar63 = pauVar63 + 1;
        auVar75 = auVar73;
        auVar88 = auVar89;
        auVar89 = auVar28;
        auVar73 = auVar30;
      } while (lVar62 < h);
    }
    uVar54 = uVar54 + 8;
    pauVar53 = (undefined1 (*) [16])(*pauVar53 + 8);
    local_8f68 = local_8f68 + 8;
    auVar89._16_16_ = _DAT_00516300;
    auVar89._0_16_ = _DAT_00516300;
    auVar82._16_16_ = _DAT_00515ee0;
    auVar82._0_16_ = _DAT_00515ee0;
    if ((uint)w <= uVar54) {
      return;
    }
  } while( true );
}

Assistant:

void av1_convolve_2d_sr_avx2(
    const uint8_t *src, int32_t src_stride, uint8_t *dst, int32_t dst_stride,
    int32_t w, int32_t h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int32_t subpel_x_qn,
    const int32_t subpel_y_qn, ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int32_t tap_x = get_filter_tap(filter_params_x, subpel_x_qn);
  const int32_t tap_y = get_filter_tap(filter_params_y, subpel_y_qn);

  const bool use_general = (tap_x == 12 || tap_y == 12);
  if (use_general) {
    convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
  } else {
    av1_convolve_2d_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                        filter_params_x, filter_params_y,
                                        subpel_x_qn, subpel_y_qn, conv_params);
  }
#else
  convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              subpel_y_qn, conv_params);
#endif
}